

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::ColumnCryptoMetaData
          (ColumnCryptoMetaData *this,ColumnCryptoMetaData *other136)

{
  *(undefined ***)this = &PTR__ColumnCryptoMetaData_027dc7e8;
  this->ENCRYPTION_WITH_FOOTER_KEY = (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_027dc718
  ;
  EncryptionWithColumnKey::EncryptionWithColumnKey(&this->ENCRYPTION_WITH_COLUMN_KEY);
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset & 0xfc);
  EncryptionWithColumnKey::operator=
            (&this->ENCRYPTION_WITH_COLUMN_KEY,&other136->ENCRYPTION_WITH_COLUMN_KEY);
  this->__isset = other136->__isset;
  return;
}

Assistant:

ColumnCryptoMetaData::ColumnCryptoMetaData(const ColumnCryptoMetaData& other136) {
  ENCRYPTION_WITH_FOOTER_KEY = other136.ENCRYPTION_WITH_FOOTER_KEY;
  ENCRYPTION_WITH_COLUMN_KEY = other136.ENCRYPTION_WITH_COLUMN_KEY;
  __isset = other136.__isset;
}